

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode39Reader.cpp
# Opt level: O0

Barcode * __thiscall
ZXing::OneD::Code39Reader::decodePattern
          (Code39Reader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_4)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first1;
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  undefined8 *in_RCX;
  long in_RSI;
  Barcode *in_RDI;
  int xStop;
  SymbologyIdentifier symbologyIdentifier;
  char symbologyModifiers [4];
  Error error;
  bool hasFullASCII;
  string fullASCII;
  char shiftChars [5];
  bool hasValidCheckSum;
  int checksum;
  value_type lastChar;
  string txt;
  int maxInterCharacterSpace;
  int xStart;
  float QUIET_ZONE_SCALE;
  FixedSparcePattern<CHAR_LEN,_6> START_PATTERN;
  anon_class_1_0_00000001 isStartOrStopSymbol;
  int minCharCount;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  Error *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  float in_stack_fffffffffffffd6c;
  undefined5 in_stack_fffffffffffffd70;
  Type in_stack_fffffffffffffd75;
  short in_stack_fffffffffffffd76;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  double in_stack_fffffffffffffd88;
  allocator<char> *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  undefined4 in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined1 readerInit;
  BarcodeFormat in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  int in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  int y;
  string *text;
  undefined4 in_stack_fffffffffffffdf4;
  SymbologyIdentifier si;
  undefined8 in_stack_fffffffffffffe00;
  Error *in_stack_fffffffffffffe08;
  string local_168 [32];
  undefined1 local_148 [48];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  char *local_100;
  undefined1 local_f4;
  byte local_f3;
  allocator<char> local_f2;
  byte local_f1;
  string local_f0 [32];
  string local_d0 [33];
  undefined4 local_af;
  undefined1 local_ab;
  byte local_aa;
  int local_a8;
  char local_a1;
  undefined4 local_a0;
  string local_90;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined2 local_30;
  anon_class_1_0_00000001 local_2d;
  int local_2c;
  undefined8 *local_20;
  
  local_20 = in_RCX;
  bVar1 = ReaderOptions::validateCode39CheckSum(*(ReaderOptions **)(in_RSI + 8));
  local_2c = 3;
  if (bVar1) {
    local_2c = 4;
  }
  local_40 = 0x5000300020000;
  local_38 = 0x80007;
  local_30 = 0;
  local_44 = 0x3f000000;
  FindLeftGuard<9,6,true>
            ((PatternView *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
             (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (FixedPattern<9,_6,_true> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  *local_20 = local_68;
  local_20[1] = local_60;
  local_20[2] = local_58;
  local_20[3] = local_50;
  bVar1 = PatternView::isValid((PatternView *)in_stack_fffffffffffffd60);
  if (!bVar1) {
    memset(in_RDI,0,0xd8);
    Result::Result((Result *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    return in_RDI;
  }
  cVar2 = OneD::RowReader::DecodeNarrowWidePattern<int[44],char[45]>
                    ((PatternView *)in_stack_fffffffffffffd60,
                     (int (*) [44])CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (char (*) [45])0x28a6c7);
  bVar1 = decodePattern::anon_class_1_0_00000001::operator()(&local_2d,cVar2);
  if (!bVar1) {
    memset(in_RDI,0,0xd8);
    Result::Result((Result *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    return in_RDI;
  }
  local_6c = PatternView::pixelsInFront((PatternView *)in_stack_fffffffffffffd60);
  local_70 = PatternView::sum((PatternView *)
                              CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                              in_stack_fffffffffffffd7c);
  local_70 = local_70 / 2;
  std::__cxx11::string::string((string *)&local_90);
  std::__cxx11::string::reserve((ulong)&local_90);
  do {
    bVar1 = PatternView::skipSymbol((PatternView *)0x28a76c);
    if ((!bVar1) ||
       (bVar1 = PatternView::skipSingle
                          ((PatternView *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c),
       !bVar1)) {
      in_RDI->_format = None;
      in_RDI->_ecLevel[0] = '\0';
      in_RDI->_ecLevel[1] = '\0';
      in_RDI->_ecLevel[2] = '\0';
      in_RDI->_ecLevel[3] = '\0';
      in_RDI->_version[0] = '\0';
      in_RDI->_version[1] = '\0';
      in_RDI->_version[2] = '\0';
      in_RDI->_version[3] = '\0';
      in_RDI->_lineCount = 0;
      (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
      *(undefined8 *)&(in_RDI->_sai).id = 0;
      (in_RDI->_sai).id._M_string_length = 0;
      *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
      (in_RDI->_sai).index = 0;
      (in_RDI->_sai).count = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
      *(undefined8 *)&in_RDI->_readerOpts = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
      (in_RDI->_error)._line = 0;
      (in_RDI->_error)._type = None;
      *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
      *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
      (in_RDI->_error)._file = (char *)0x0;
      (in_RDI->_error)._msg._M_string_length = 0;
      (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
      (in_RDI->_content).symbology.code = '\0';
      (in_RDI->_content).symbology.modifier = '\0';
      (in_RDI->_content).symbology.eciModifierOffset = '\0';
      (in_RDI->_content).symbology.aiFlag = None;
      (in_RDI->_content).defaultCharset = Unknown;
      (in_RDI->_content).hasECI = false;
      *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
      *(undefined8 *)&(in_RDI->_error)._msg = 0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      in_RDI->_isMirrored = false;
      in_RDI->_isInverted = false;
      in_RDI->_readerInit = false;
      *(undefined5 *)&in_RDI->field_0xd3 = 0;
      Result::Result((Result *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
      local_a0 = 1;
      goto LAB_0028af87;
    }
    cVar2 = OneD::RowReader::DecodeNarrowWidePattern<int[44],char[45]>
                      ((PatternView *)in_stack_fffffffffffffd60,
                       (int (*) [44])CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                       (char (*) [45])0x28a85b);
    std::__cxx11::string::operator+=((string *)&local_90,cVar2);
    pcVar7 = (char *)std::__cxx11::string::back();
    if (*pcVar7 == '\0') {
      in_RDI->_format = None;
      in_RDI->_ecLevel[0] = '\0';
      in_RDI->_ecLevel[1] = '\0';
      in_RDI->_ecLevel[2] = '\0';
      in_RDI->_ecLevel[3] = '\0';
      in_RDI->_version[0] = '\0';
      in_RDI->_version[1] = '\0';
      in_RDI->_version[2] = '\0';
      in_RDI->_version[3] = '\0';
      in_RDI->_lineCount = 0;
      (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
      *(undefined8 *)&(in_RDI->_sai).id = 0;
      (in_RDI->_sai).id._M_string_length = 0;
      *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
      (in_RDI->_sai).index = 0;
      (in_RDI->_sai).count = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
      *(undefined8 *)&in_RDI->_readerOpts = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
      (in_RDI->_error)._line = 0;
      (in_RDI->_error)._type = None;
      *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
      *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
      (in_RDI->_error)._file = (char *)0x0;
      (in_RDI->_error)._msg._M_string_length = 0;
      (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
      (in_RDI->_content).symbology.code = '\0';
      (in_RDI->_content).symbology.modifier = '\0';
      (in_RDI->_content).symbology.eciModifierOffset = '\0';
      (in_RDI->_content).symbology.aiFlag = None;
      (in_RDI->_content).defaultCharset = Unknown;
      (in_RDI->_content).hasECI = false;
      *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
      *(undefined8 *)&(in_RDI->_error)._msg = 0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      in_RDI->_isMirrored = false;
      in_RDI->_isInverted = false;
      in_RDI->_readerInit = false;
      *(undefined5 *)&in_RDI->field_0xd3 = 0;
      Result::Result((Result *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
      local_a0 = 1;
      goto LAB_0028af87;
    }
    pcVar7 = (char *)std::__cxx11::string::back();
    bVar1 = decodePattern::anon_class_1_0_00000001::operator()(&local_2d,*pcVar7);
    si = SUB84(in_stack_fffffffffffffe00,0);
    readerInit = (undefined1)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
    in_stack_fffffffffffffdf4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdf4);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  text = &local_90;
  std::__cxx11::string::pop_back();
  iVar4 = Size<std::__cxx11::string>(&in_stack_fffffffffffffd60->_msg);
  if (local_2c + -2 <= iVar4) {
    bVar1 = PatternView::hasQuietZoneAfter<true>
                      ((PatternView *)
                       CONCAT26(in_stack_fffffffffffffd76,
                                CONCAT15(in_stack_fffffffffffffd75,in_stack_fffffffffffffd70)),
                       in_stack_fffffffffffffd6c);
    y = CONCAT13(bVar1,(int3)in_stack_fffffffffffffde4);
    if (bVar1) {
      pcVar7 = (char *)std::__cxx11::string::back();
      local_a1 = *pcVar7;
      std::__cxx11::string::pop_back();
      iVar5 = TransformReduce<std::__cxx11::string,int,ZXing::OneD::Code39Reader::decodePattern(int,ZXing::PatternView&,std::unique_ptr<ZXing::OneD::RowReader::DecodingState,std::default_delete<ZXing::OneD::RowReader::DecodingState>>&)const::__1>
                        (&local_90,0);
      local_aa = local_a1 == "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%*"[iVar5 % 0x2b];
      local_a8 = iVar5;
      if (!(bool)local_aa) {
        std::__cxx11::string::push_back((char)&local_90);
      }
      local_af = 0x2b2f2524;
      local_ab = 0;
      bVar1 = ReaderOptions::tryCode39ExtendedMode(*(ReaderOptions **)(in_RSI + 8));
      local_f1 = 0;
      local_f3 = 0;
      if (bVar1) {
        std::__cxx11::string::string(local_f0,(string *)&local_90);
        local_f1 = 1;
        DecodeCode39AndCode93FullASCII
                  (in_stack_fffffffffffffdc8,(char *)CONCAT44(iVar5,in_stack_fffffffffffffdc0));
      }
      else {
        std::allocator<char>::allocator();
        local_f3 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                   in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      }
      if ((local_f3 & 1) != 0) {
        std::allocator<char>::~allocator(&local_f2);
      }
      if ((local_f1 & 1) != 0) {
        std::__cxx11::string::~string(local_f0);
      }
      uVar6 = std::__cxx11::string::empty();
      local_f4 = false;
      if ((uVar6 & 1) == 0) {
        local_108 = std::__cxx11::string::begin();
        local_110 = std::__cxx11::string::end();
        __first1._M_current._4_4_ = in_stack_fffffffffffffd7c;
        __first1._M_current._0_4_ = in_stack_fffffffffffffd78;
        __last1._M_current._5_1_ = in_stack_fffffffffffffd75;
        __last1._M_current._0_5_ = in_stack_fffffffffffffd70;
        __last1._M_current._6_2_ = in_stack_fffffffffffffd76;
        local_100 = (char *)std::
                            find_first_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*>
                                      (__first1,__last1,
                                       (char *)CONCAT44(in_stack_fffffffffffffd6c,
                                                        in_stack_fffffffffffffd68),
                                       (char *)in_stack_fffffffffffffd60);
        local_118 = std::__cxx11::string::end();
        local_f4 = __gnu_cxx::operator!=
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffffd60,
                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      }
      if ((bool)local_f4 != false) {
        std::__cxx11::string::operator=((string *)&local_90,local_d0);
      }
      if ((local_aa & 1) != 0) {
        std::__cxx11::string::push_back((char)&local_90);
      }
      bVar3 = ReaderOptions::validateCode39CheckSum(*(ReaderOptions **)(in_RSI + 8));
      bVar1 = false;
      if ((bVar3) && ((local_aa & 1) == 0)) {
        std::__cxx11::string::string(local_168);
        bVar1 = true;
        Error::Error((Error *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     in_stack_fffffffffffffd76,in_stack_fffffffffffffd75,
                     (string *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      }
      else {
        memset(local_148,0,0x30);
        Error::Error(in_stack_fffffffffffffd60);
      }
      if (bVar1) {
        std::__cxx11::string::~string(local_168);
      }
      PatternView::pixelsTillEnd((PatternView *)in_stack_fffffffffffffd60);
      Error::Error(in_stack_fffffffffffffd60,
                   (Error *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      Result::Result((Result *)CONCAT44(in_stack_fffffffffffffdf4,iVar4),text,y,
                     in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
                     si,in_stack_fffffffffffffe08,(bool)readerInit);
      Error::~Error((Error *)0x28aedb);
      local_a0 = 1;
      Error::~Error((Error *)0x28aef3);
      std::__cxx11::string::~string(local_d0);
      goto LAB_0028af87;
    }
  }
  in_RDI->_format = None;
  in_RDI->_ecLevel[0] = '\0';
  in_RDI->_ecLevel[1] = '\0';
  in_RDI->_ecLevel[2] = '\0';
  in_RDI->_ecLevel[3] = '\0';
  in_RDI->_version[0] = '\0';
  in_RDI->_version[1] = '\0';
  in_RDI->_version[2] = '\0';
  in_RDI->_version[3] = '\0';
  in_RDI->_lineCount = 0;
  (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
  *(undefined8 *)&(in_RDI->_sai).id = 0;
  (in_RDI->_sai).id._M_string_length = 0;
  *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
  (in_RDI->_sai).index = 0;
  (in_RDI->_sai).count = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
  *(undefined8 *)&in_RDI->_readerOpts = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
  (in_RDI->_error)._line = 0;
  (in_RDI->_error)._type = None;
  *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
  *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
  (in_RDI->_error)._file = (char *)0x0;
  (in_RDI->_error)._msg._M_string_length = 0;
  (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
  (in_RDI->_content).symbology.code = '\0';
  (in_RDI->_content).symbology.modifier = '\0';
  (in_RDI->_content).symbology.eciModifierOffset = '\0';
  (in_RDI->_content).symbology.aiFlag = None;
  (in_RDI->_content).defaultCharset = Unknown;
  (in_RDI->_content).hasECI = false;
  *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
  *(undefined8 *)&(in_RDI->_error)._msg = 0;
  (in_RDI->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_RDI->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  in_RDI->_isMirrored = false;
  in_RDI->_isInverted = false;
  in_RDI->_readerInit = false;
  *(undefined5 *)&in_RDI->field_0xd3 = 0;
  Result::Result((Result *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  local_a0 = 1;
LAB_0028af87:
  std::__cxx11::string::~string((string *)&local_90);
  return in_RDI;
}

Assistant:

Barcode Code39Reader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<RowReader::DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop and checksum characters)
	int minCharCount = _opts.validateCode39CheckSum() ? 4 : 3;
	auto isStartOrStopSymbol = [](char c) { return c == '*'; };

	// provide the indices with the narrow bars/spaces which have to be equally wide
	constexpr auto START_PATTERN = FixedSparcePattern<CHAR_LEN, 6>{0, 2, 3, 5, 7, 8};
	// quiet zone is half the width of a character symbol
	constexpr float QUIET_ZONE_SCALE = 0.5f;

	next = FindLeftGuard(next, minCharCount * CHAR_LEN, START_PATTERN, QUIET_ZONE_SCALE * 12);
	if (!next.isValid())
		return {};

	if (!isStartOrStopSymbol(DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET))) // read off the start pattern
		return {};

	int xStart = next.pixelsInFront();
	int maxInterCharacterSpace = next.sum() / 2; // spec actually says 1 narrow space, width/2 is about 4

	std::string txt;
	txt.reserve(20);

	do {
		// check remaining input width and inter-character space
		if (!next.skipSymbol() || !next.skipSingle(maxInterCharacterSpace))
			return {};

		txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (!isStartOrStopSymbol(txt.back()));

	txt.pop_back(); // remove asterisk

	// check txt length and whitespace after the last char. See also FindStartPattern.
	if (Size(txt) < minCharCount - 2 || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	auto lastChar = txt.back();
	txt.pop_back();
	int checksum = TransformReduce(txt, 0, [](char c) { return IndexOf(ALPHABET, c); });
	bool hasValidCheckSum = lastChar == ALPHABET[checksum % 43];
	if (!hasValidCheckSum)
		txt.push_back(lastChar);

	const char shiftChars[] = "$%/+";
	auto fullASCII = _opts.tryCode39ExtendedMode() ? DecodeCode39AndCode93FullASCII(txt, shiftChars) : "";
	bool hasFullASCII = !fullASCII.empty() && std::find_first_of(txt.begin(), txt.end(), shiftChars, shiftChars + 4) != txt.end();
	if (hasFullASCII)
		txt = fullASCII;

	if (hasValidCheckSum)
		txt.push_back(lastChar);

	Error error = _opts.validateCode39CheckSum() && !hasValidCheckSum ? ChecksumError() : Error();

	// Symbology identifier modifiers ISO/IEC 16388:2007 Annex C Table C.1
	constexpr const char symbologyModifiers[4] = { '0', '1' /*checksum*/, '4' /*full ASCII*/, '5' /*checksum + full ASCII*/ };
	SymbologyIdentifier symbologyIdentifier = {'A', symbologyModifiers[(int)hasValidCheckSum + 2 * (int)hasFullASCII]};

	int xStop = next.pixelsTillEnd();
	return {std::move(txt), rowNumber, xStart, xStop, BarcodeFormat::Code39, symbologyIdentifier, error};
}